

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall
mkvmuxer::Colour::SetMasteringMetadata(Colour *this,MasteringMetadata *mastering_metadata)

{
  MasteringMetadata *this_00;
  bool bVar1;
  MasteringMetadata *this_01;
  
  this_01 = (MasteringMetadata *)operator_new(0x28);
  this_01->luminance_max_ = 3.4028235e+38;
  this_01->luminance_min_ = 3.4028235e+38;
  this_01->r_ = (PrimaryChromaticity *)0x0;
  this_01->g_ = (PrimaryChromaticity *)0x0;
  this_01->b_ = (PrimaryChromaticity *)0x0;
  this_01->white_point_ = (PrimaryChromaticity *)0x0;
  this_01->luminance_max_ = mastering_metadata->luminance_max_;
  this_01->luminance_min_ = mastering_metadata->luminance_min_;
  bVar1 = MasteringMetadata::SetChromaticity
                    (this_01,mastering_metadata->r_,mastering_metadata->g_,mastering_metadata->b_,
                     mastering_metadata->white_point_);
  if (bVar1) {
    this_00 = this->mastering_metadata_;
    if (this_00 != (MasteringMetadata *)0x0) {
      MasteringMetadata::~MasteringMetadata(this_00);
      operator_delete(this_00);
    }
    this->mastering_metadata_ = this_01;
    this_01 = (MasteringMetadata *)0x0;
  }
  if (this_01 != (MasteringMetadata *)0x0) {
    MasteringMetadata::~MasteringMetadata(this_01);
    operator_delete(this_01);
  }
  return bVar1;
}

Assistant:

bool Colour::SetMasteringMetadata(const MasteringMetadata& mastering_metadata) {
  std::unique_ptr<MasteringMetadata> mm_ptr(new MasteringMetadata());
  if (!mm_ptr.get())
    return false;

  mm_ptr->set_luminance_max(mastering_metadata.luminance_max());
  mm_ptr->set_luminance_min(mastering_metadata.luminance_min());

  if (!mm_ptr->SetChromaticity(mastering_metadata.r(), mastering_metadata.g(),
                               mastering_metadata.b(),
                               mastering_metadata.white_point())) {
    return false;
  }

  delete mastering_metadata_;
  mastering_metadata_ = mm_ptr.release();
  return true;
}